

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

void __thiscall
embree::TutorialBuildBenchmark::registerBenchmark
          (TutorialBuildBenchmark *this,string *name,int argc,char **argv)

{
  pointer pcVar1;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  registerBuildBenchmark(this,&local_50,UPDATE_DYNAMIC_DEFORMABLE,argc,argv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  pcVar1 = (name->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + name->_M_string_length);
  registerBuildBenchmark(this,&local_70,UPDATE_DYNAMIC_DYNAMIC,argc,argv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  pcVar1 = (name->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + name->_M_string_length);
  registerBuildBenchmark(this,&local_90,UPDATE_DYNAMIC_STATIC,argc,argv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  pcVar1 = (name->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + name->_M_string_length);
  registerBuildBenchmark(this,&local_b0,CREATE_DYNAMIC_DEFORMABLE,argc,argv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  pcVar1 = (name->_M_dataplus)._M_p;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar1,pcVar1 + name->_M_string_length);
  registerBuildBenchmark(this,&local_d0,CREATE_DYNAMIC_DYNAMIC,argc,argv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  pcVar1 = (name->_M_dataplus)._M_p;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar1,pcVar1 + name->_M_string_length);
  registerBuildBenchmark(this,&local_f0,CREATE_DYNAMIC_STATIC,argc,argv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  pcVar1 = (name->_M_dataplus)._M_p;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar1,pcVar1 + name->_M_string_length);
  registerBuildBenchmark(this,&local_110,CREATE_STATIC_STATIC,argc,argv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  pcVar1 = (name->_M_dataplus)._M_p;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar1,pcVar1 + name->_M_string_length);
  registerBuildBenchmark(this,&local_130,CREATE_HIGH_QUALITY_STATIC_STATIC,argc,argv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  pcVar1 = (name->_M_dataplus)._M_p;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar1,pcVar1 + name->_M_string_length);
  registerBuildBenchmark(this,&local_150,CREATE_USER_THREADS_STATIC_STATIC,argc,argv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  return;
}

Assistant:

void TutorialBuildBenchmark::registerBenchmark(std::string const& name, int argc, char** argv)
{
  registerBuildBenchmark(name, BuildBenchType::UPDATE_DYNAMIC_DEFORMABLE,         argc, argv);
  registerBuildBenchmark(name, BuildBenchType::UPDATE_DYNAMIC_DYNAMIC,            argc, argv);
  registerBuildBenchmark(name, BuildBenchType::UPDATE_DYNAMIC_STATIC,             argc, argv);
  registerBuildBenchmark(name, BuildBenchType::CREATE_DYNAMIC_DEFORMABLE,         argc, argv);
  registerBuildBenchmark(name, BuildBenchType::CREATE_DYNAMIC_DYNAMIC,            argc, argv);
  registerBuildBenchmark(name, BuildBenchType::CREATE_DYNAMIC_STATIC,             argc, argv);
  registerBuildBenchmark(name, BuildBenchType::CREATE_STATIC_STATIC,              argc, argv);
  registerBuildBenchmark(name, BuildBenchType::CREATE_HIGH_QUALITY_STATIC_STATIC, argc, argv);
  registerBuildBenchmark(name, BuildBenchType::CREATE_USER_THREADS_STATIC_STATIC, argc, argv);
}